

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_functions.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::BindEnumRangeBoundaryFunction
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalTypeId LVar1;
  byte bVar2;
  bool bVar3;
  pointer pEVar4;
  BinderException *pBVar5;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  LogicalType *in_stack_fffffffffffffdd8;
  LogicalType *in_stack_fffffffffffffde0;
  Expression *in_stack_fffffffffffffdf0;
  byte local_1d1;
  bool local_189;
  bool local_143;
  allocator local_141;
  string local_140 [38];
  undefined1 local_11a;
  allocator local_119;
  string local_118 [39];
  byte local_f1;
  LogicalType local_f0 [24];
  LogicalType local_d8 [30];
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [39];
  byte local_91;
  LogicalType local_90 [30];
  undefined1 local_72;
  allocator local_71;
  string local_70 [55];
  byte local_39;
  LogicalType local_38 [56];
  
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffde0);
  CheckEnumParameter(in_stack_fffffffffffffdf0);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffde0);
  CheckEnumParameter(in_stack_fffffffffffffdf0);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffde0);
  LVar1 = LogicalType::id((LogicalType *)(pEVar4 + 0x38));
  local_39 = 0;
  local_143 = false;
  if (LVar1 != ENUM) {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffde0);
    duckdb::LogicalType::LogicalType(local_38,SQLNULL);
    local_39 = 1;
    local_143 = LogicalType::operator!=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  }
  if ((local_39 & 1) != 0) {
    duckdb::LogicalType::~LogicalType(local_38);
  }
  if (local_143 != false) {
    local_72 = 1;
    pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"This function needs an ENUM as an argument",&local_71);
    duckdb::BinderException::BinderException(pBVar5,local_70);
    local_72 = 0;
    __cxa_throw(pBVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffde0);
  LVar1 = LogicalType::id((LogicalType *)(pEVar4 + 0x38));
  local_91 = 0;
  local_189 = false;
  if (LVar1 != ENUM) {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffde0);
    duckdb::LogicalType::LogicalType(local_90,SQLNULL);
    local_91 = 1;
    local_189 = LogicalType::operator!=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  }
  if ((local_91 & 1) != 0) {
    duckdb::LogicalType::~LogicalType(local_90);
  }
  if (local_189 != false) {
    local_ba = 1;
    pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"This function needs an ENUM as an argument",&local_b9);
    duckdb::BinderException::BinderException(pBVar5,local_b8);
    local_ba = 0;
    __cxa_throw(pBVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffde0);
  duckdb::LogicalType::LogicalType(local_d8,SQLNULL);
  local_f1 = 0;
  bVar2 = duckdb::LogicalType::operator==((LogicalType *)(pEVar4 + 0x38),local_d8);
  local_1d1 = 0;
  if ((bVar2 & 1) != 0) {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffde0);
    duckdb::LogicalType::LogicalType(local_f0,SQLNULL);
    local_f1 = 1;
    local_1d1 = duckdb::LogicalType::operator==((LogicalType *)(pEVar4 + 0x38),local_f0);
  }
  if ((local_f1 & 1) != 0) {
    duckdb::LogicalType::~LogicalType(local_f0);
  }
  duckdb::LogicalType::~LogicalType(local_d8);
  if ((local_1d1 & 1) != 0) {
    local_11a = 1;
    pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"This function needs an ENUM as an argument",&local_119);
    duckdb::BinderException::BinderException(pBVar5,local_118);
    local_11a = 0;
    __cxa_throw(pBVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffde0);
  LVar1 = LogicalType::id((LogicalType *)(pEVar4 + 0x38));
  if (LVar1 == ENUM) {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffde0);
    LVar1 = LogicalType::id((LogicalType *)(pEVar4 + 0x38));
    if (LVar1 == ENUM) {
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffde0);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffde0);
      bVar3 = LogicalType::operator!=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      if (bVar3) {
        pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_140,"The parameters need to link to ONLY one enum OR be NULL ",&local_141);
        duckdb::BinderException::BinderException(pBVar5,local_140);
        __cxa_throw(pBVar5,&BinderException::typeinfo,BinderException::~BinderException);
      }
    }
  }
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<std::default_delete<duckdb::FunctionData>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> BindEnumRangeBoundaryFunction(ClientContext &context, ScalarFunction &bound_function,
                                                       vector<unique_ptr<Expression>> &arguments) {
	CheckEnumParameter(*arguments[0]);
	CheckEnumParameter(*arguments[1]);
	if (arguments[0]->return_type.id() != LogicalTypeId::ENUM && arguments[0]->return_type != LogicalType::SQLNULL) {
		throw BinderException("This function needs an ENUM as an argument");
	}
	if (arguments[1]->return_type.id() != LogicalTypeId::ENUM && arguments[1]->return_type != LogicalType::SQLNULL) {
		throw BinderException("This function needs an ENUM as an argument");
	}
	if (arguments[0]->return_type == LogicalType::SQLNULL && arguments[1]->return_type == LogicalType::SQLNULL) {
		throw BinderException("This function needs an ENUM as an argument");
	}
	if (arguments[0]->return_type.id() == LogicalTypeId::ENUM &&
	    arguments[1]->return_type.id() == LogicalTypeId::ENUM &&
	    arguments[0]->return_type != arguments[1]->return_type) {
		throw BinderException("The parameters need to link to ONLY one enum OR be NULL ");
	}
	return nullptr;
}